

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O2

void read_filter_intra_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  ulong uVar3;
  
  pMVar1 = *xd->mi;
  if ((((pMVar1->mode == '\0') && ((pMVar1->palette_mode_info).palette_size[0] == '\0')) &&
      (uVar3 = (ulong)pMVar1->bsize, uVar3 != 0xff)) &&
     (((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar3 & 0x3f) & 1) != 0)) &&
      ((0x2f0bffUL >> (uVar3 & 0x3f) & 1) != 0)))) {
    iVar2 = aom_read_symbol_(r,xd->tile_ctx->filter_intra_cdfs[uVar3],2);
    (pMVar1->filter_intra_mode_info).use_filter_intra = (uint8_t)iVar2;
    if ((uint8_t)iVar2 != '\0') {
      iVar2 = aom_read_symbol_(r,xd->tile_ctx->filter_intra_mode_cdf,5);
      (pMVar1->filter_intra_mode_info).filter_intra_mode = (FILTER_INTRA_MODE)iVar2;
    }
  }
  else {
    (pMVar1->filter_intra_mode_info).use_filter_intra = '\0';
  }
  return;
}

Assistant:

static void read_filter_intra_mode_info(const AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, aom_reader *r) {
  MB_MODE_INFO *const mbmi = xd->mi[0];
  FILTER_INTRA_MODE_INFO *filter_intra_mode_info =
      &mbmi->filter_intra_mode_info;

  if (av1_filter_intra_allowed(cm, mbmi)) {
    filter_intra_mode_info->use_filter_intra = aom_read_symbol(
        r, xd->tile_ctx->filter_intra_cdfs[mbmi->bsize], 2, ACCT_STR);
    if (filter_intra_mode_info->use_filter_intra) {
      filter_intra_mode_info->filter_intra_mode = aom_read_symbol(
          r, xd->tile_ctx->filter_intra_mode_cdf, FILTER_INTRA_MODES, ACCT_STR);
    }
  } else {
    filter_intra_mode_info->use_filter_intra = 0;
  }
}